

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O2

string * expandEsiStr(string *esiStr)

{
  int __val;
  int iVar1;
  istream *piVar2;
  long lVar3;
  size_type sz;
  string num;
  string local_1d0;
  istringstream ss1;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss1,(string *)esiStr,_S_in);
  num._M_dataplus._M_p = (pointer)&num.field_2;
  num._M_string_length = 0;
  num.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)esiStr);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss1,(string *)&num,',');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    trim(&num," \t\n\r\f\v");
    std::__cxx11::string::_M_assign((string *)&num);
    lVar3 = std::__cxx11::string::find_first_of((char *)&num,0x10400b);
    if (lVar3 == -1) {
      std::__cxx11::string::append((string *)esiStr);
      std::__cxx11::string::append((char *)esiStr);
    }
    else {
      __val = std::__cxx11::stoi(&num,&sz,10);
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&num);
      std::__cxx11::string::operator=((string *)&num,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::find_first_not_of((char *)&num,0x10400b);
      std::__cxx11::string::erase((ulong)&num,0);
      iVar1 = std::__cxx11::stoi(&num,&sz,10);
      for (; __val <= iVar1; __val = __val + 1) {
        std::__cxx11::to_string(&local_1d0,__val);
        std::__cxx11::string::append((string *)esiStr);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::append((char *)esiStr);
      }
    }
  }
  rtrim(esiStr,",");
  std::__cxx11::string::_M_assign((string *)esiStr);
  std::__cxx11::string::~string((string *)&num);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss1);
  return esiStr;
}

Assistant:

string& expandEsiStr (string& esiStr) {

    istringstream ss1(esiStr);
    string num;
    esiStr = "";

    int i = 0;

    /* Look at all comma separated ESIs or ESI ranges */
    while (getline(ss1, num, ',')) {

        /* Remove whitespace if any */
        num = trim(num);

        /* Check if its a range */
        std::size_t found = num.find_first_of("-");

        /* If it is a range find start and end of range and enumerate the ESIs
           and append to ESI string */
        if (found!=std::string::npos) {

            std::string::size_type sz;
            int startR = std::stoi (num,&sz);
            num = num.substr(sz);
            num.erase(0, num.find_first_not_of("-"));
            int endR = std::stoi(num,&sz);

            for (int i = startR; i <= endR; i++)
                {
                    esiStr.append(to_string(i));
                    esiStr.append(",");
                }
        }
        /* If it is not a range, append ESI to ESI string */
        else {
            esiStr.append(num);
            esiStr.append(",");
        }
        i++;
    }

    /* Remove trailing comma */
    esiStr = rtrim(esiStr, ",");

    return esiStr;
}